

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qtabbar.cpp
# Opt level: O0

int __thiscall QTabBar::qt_metacall(QTabBar *this,Call _c,int _id,void **_a)

{
  int iVar1;
  undefined8 *in_RCX;
  undefined4 in_EDX;
  int in_ESI;
  void **in_RDI;
  long in_FS_OFFSET;
  void **in_stack_00000030;
  int in_stack_00000038;
  Call in_stack_0000003c;
  QObject *in_stack_00000040;
  QMetaType local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = QWidget::qt_metacall
                    ((QWidget *)CONCAT44(in_ESI,in_EDX),(Call)((ulong)in_RCX >> 0x20),(int)in_RCX,
                     in_RDI);
  if (-1 < iVar1) {
    if (in_ESI == 0) {
      if (iVar1 < 6) {
        qt_static_metacall(in_stack_00000040,in_stack_0000003c,in_stack_00000038,in_stack_00000030);
      }
      iVar1 = iVar1 + -6;
    }
    if (in_ESI == 7) {
      if (iVar1 < 6) {
        memset(&local_10,0,8);
        QMetaType::QMetaType(&local_10);
        *(QMetaTypeInterface **)*in_RCX = local_10.d_ptr;
      }
      iVar1 = iVar1 + -6;
    }
    if ((((in_ESI == 1) || (in_ESI == 2)) || (in_ESI == 3)) || ((in_ESI == 8 || (in_ESI == 6)))) {
      qt_static_metacall(in_stack_00000040,in_stack_0000003c,in_stack_00000038,in_stack_00000030);
      iVar1 = iVar1 + -0xe;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return iVar1;
}

Assistant:

int QTabBar::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QWidget::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 6)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 6;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 6)
            *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType();
        _id -= 6;
    }
    if (_c == QMetaObject::ReadProperty || _c == QMetaObject::WriteProperty
            || _c == QMetaObject::ResetProperty || _c == QMetaObject::BindableProperty
            || _c == QMetaObject::RegisterPropertyMetaType) {
        qt_static_metacall(this, _c, _id, _a);
        _id -= 14;
    }
    return _id;
}